

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_hostapi_skeleton.c
# Opt level: O1

PaError ReadStream(PaStream *s,void *buffer,unsigned_long frames)

{
  bool bVar1;
  int iVar2;
  unsigned_long numFrames;
  char *format;
  unsigned_long framesGot;
  int xrun;
  void *userBuffer;
  unsigned_long framesAvail;
  PaError local_5c;
  unsigned_long local_58;
  int local_4c;
  void *local_48;
  undefined8 local_40;
  ulong local_38;
  
  local_40 = *(undefined8 *)((long)s + 0x340);
  if (*(long *)((long)s + 0x2c0) == 0) {
    PaUtil_DebugPrint(
                     "Expression \'stream->capture.pcm\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4387\n"
                     );
    local_5c = -0x26f7;
  }
  else {
    *(undefined8 *)((long)s + 0x340) = 0;
    local_5c = 0;
    if (0.0 < *(double *)((long)s + 0x280)) {
      *(undefined8 *)((long)s + 0x280) = 0;
      local_5c = -0x26fd;
    }
    local_48 = buffer;
    if (*(int *)((long)s + 0x298) == 0) {
      local_48 = *(void **)((long)s + 0x2e8);
      memcpy(local_48,buffer,(long)*(int *)((long)s + 0x290) << 3);
    }
    iVar2 = snd_pcm_state(*(undefined8 *)((long)s + 0x2c0));
    if ((iVar2 == 2) && (iVar2 = snd_pcm_start(*(undefined8 *)((long)s + 0x2c0)), iVar2 < 0)) {
      ReadStream_cold_1();
      local_5c = -9999;
    }
    else {
      do {
        if (frames == 0) break;
        local_4c = 0;
        paUtilErr_ = PaAlsaStream_WaitForFrames((PaAlsaStream *)s,&local_38,&local_4c);
        if (paUtilErr_ < 0) {
          format = 
          "Expression \'PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4418\n"
          ;
LAB_0010ec0b:
          bVar1 = false;
          PaUtil_DebugPrint(format);
          local_5c = paUtilErr_;
        }
        else {
          local_58 = local_38;
          if (frames <= local_38) {
            local_58 = frames;
          }
          paUtilErr_ = PaAlsaStream_SetUpBuffers((PaAlsaStream *)s,&local_58,&local_4c);
          if (paUtilErr_ < 0) {
            format = 
            "Expression \'PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4421\n"
            ;
            goto LAB_0010ec0b;
          }
          bVar1 = true;
          if (local_58 != 0) {
            numFrames = PaUtil_CopyInput((PaUtilBufferProcessor *)((long)s + 0x68),&local_48,
                                         local_58);
            local_58 = numFrames;
            paUtilErr_ = PaAlsaStream_EndProcessing((PaAlsaStream *)s,numFrames,&local_4c);
            if (paUtilErr_ < 0) {
              format = 
              "Expression \'PaAlsaStream_EndProcessing( stream, framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4425\n"
              ;
              goto LAB_0010ec0b;
            }
            frames = frames - numFrames;
          }
        }
      } while (bVar1);
    }
  }
  *(undefined8 *)((long)s + 0x340) = local_40;
  return local_5c;
}

Assistant:

static PaError ReadStream( PaStream* s,
                           void *buffer,
                           unsigned long frames )
{
    PaSkeletonStream *stream = (PaSkeletonStream*)s;

    /* suppress unused variable warnings */
    (void) buffer;
    (void) frames;
    (void) stream;
    
    /* IMPLEMENT ME, see portaudio.h for required behavior*/

    return paNoError;
}